

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O0

void xz_reset(xz_statep state)

{
  xz_statep state_local;
  
  state->have = 0;
  state->eof = 0;
  state->how = 0;
  state->direct = 1;
  state->seek = 0;
  xz_error(state,0,(char *)0x0);
  state->pos = 0;
  (state->strm).avail_in = 0;
  (state->zstrm).avail_in = 0;
  return;
}

Assistant:

static void
xz_reset(xz_statep state)
{
    state->have = 0;            /* no output data available */
    state->eof = 0;             /* not at end of file */
    state->how = LOOK;          /* look for gzip header */
    state->direct = 1;          /* default for empty file */
    state->seek = 0;            /* no seek request pending */
    xz_error(state, LZMA_OK, NULL);     /* clear error */
    state->pos = 0;             /* no uncompressed data yet */
    state->strm.avail_in = 0;   /* no input data yet */
#ifdef LIBXML_ZLIB_ENABLED
    state->zstrm.avail_in = 0;  /* no input data yet */
#endif
}